

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.hpp
# Opt level: O0

Option<Kernel::TermList> __thiscall
MemoNonVars<Kernel::PolyNf,_Kernel::TermList>::get
          (MemoNonVars<Kernel::PolyNf,_Kernel::TermList> *this,PolyNf *orig)

{
  bool bVar1;
  Value extraout_RDX;
  PolyNf *in_RSI;
  Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash> *in_RDI;
  Option<Kernel::TermList> OVar3;
  PolyNf *key;
  Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash> *this_00;
  Value VVar2;
  
  key = in_RSI;
  this_00 = in_RDI;
  bVar1 = isVar((PolyNf *)0x92b113);
  if (bVar1) {
    memset(in_RDI,0,0x10);
    Lib::Option<Kernel::TermList>::Option((Option<Kernel::TermList> *)0x92b132);
    VVar2 = extraout_RDX;
  }
  else {
    Lib::Map<Kernel::PolyNf,_Kernel::TermList,_Lib::DefaultHash>::tryGet(this_00,key);
    OVar3 = Lib::Option<const_Kernel::TermList_&>::toOwned
                      ((Option<const_Kernel::TermList_&> *)in_RSI);
    VVar2 = (Value)OVar3.super_OptionBase<Kernel::TermList>._elem._elem;
  }
  OVar3.super_OptionBase<Kernel::TermList>._elem._elem = VVar2;
  OVar3.super_OptionBase<Kernel::TermList>._0_8_ = in_RDI;
  return (Option<Kernel::TermList>)OVar3.super_OptionBase<Kernel::TermList>;
}

Assistant:

Option<Result> get(const Arg& orig)
  { return isVar(orig) ? Option<Result>() : _memo.tryGet(orig).toOwned(); }